

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O2

Duration absl::lts_20240722::Floor(Duration d,Duration unit)

{
  Duration DVar1;
  Duration DVar2;
  
  DVar1 = Trunc(d,unit);
  DVar2.rep_lo_ = DVar1.rep_lo_;
  if (DVar1.rep_hi_ == d.rep_hi_) {
    if (d.rep_lo_ < DVar2.rep_lo_) {
LAB_0010a02d:
      DVar2.rep_hi_.hi_ = 0;
      DVar2.rep_hi_.lo_ = unit.rep_lo_;
      DVar2 = AbsDuration((lts_20240722 *)unit.rep_hi_,DVar2);
      DVar1 = operator-(DVar1,DVar2);
      return DVar1;
    }
  }
  else if ((long)d.rep_hi_ < (long)DVar1.rep_hi_) goto LAB_0010a02d;
  return DVar1;
}

Assistant:

Duration Floor(const Duration d, const Duration unit) {
  const absl::Duration td = Trunc(d, unit);
  return td <= d ? td : td - AbsDuration(unit);
}